

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_StartConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  TFlags<ActorFlag4,_unsigned_int> local_4c;
  AActor *local_48;
  AActor *target;
  FActorIterator iterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.id = arg2;
  iterator._12_4_ = arg1;
  FActorIterator::FActorIterator((FActorIterator *)&target,arg0);
  local_48 = FActorIterator::Next((FActorIterator *)&target);
  if (local_48 == (AActor *)0x0) {
    ln_local._4_4_ = 0;
  }
  else if ((((it == (AActor *)0x0) || (it->player == (player_t *)0x0)) ||
           (it->player->mo != (APlayerPawn *)it)) || (it->health < 1)) {
    ln_local._4_4_ = 0;
  }
  else if (local_48->health < 1) {
    ln_local._4_4_ = 0;
  }
  else {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_4c,
               (int)local_48 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
              );
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    if (uVar1 == 0) {
      if (local_48->Conversation == (FStrifeDialogueNode *)0x0) {
        ln_local._4_4_ = 0;
      }
      else {
        AActor::ConversationAnimation(local_48,0);
        P_StartConversation(local_48,it,iterator._12_4_ != 0,true);
        ln_local._4_4_ = 1;
      }
    }
    else {
      ln_local._4_4_ = 0;
    }
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_StartConversation)
// StartConversation (tid, facetalker)
{
	FActorIterator iterator (arg0);

	AActor *target = iterator.Next();

	// Nothing to talk to
	if (target == NULL)
	{
		return false;
	}
	
	// Only living players are allowed to start conversations
	if (it == NULL || it->player == NULL || it->player->mo != it || it->health<=0)
	{
		return false;
	}

	// Dead things can't talk.
	if (target->health <= 0)
	{
		return false;
	}
	// Fighting things don't talk either.
	if (target->flags4 & MF4_INCOMBAT)
	{
		return false;
	}
	if (target->Conversation != NULL)
	{
		// Give the NPC a chance to play a brief animation
		target->ConversationAnimation (0);
		P_StartConversation (target, it, !!arg1, true);
		return true;
	}
	return false;
}